

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

StringRef * __thiscall
axl::err::ErrorHdr::getDescription(StringRef *__return_storage_ptr__,ErrorHdr *this)

{
  ErrorMgr *this_00;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_38;
  
  this_00 = getErrorMgr();
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::BufRef(&BStack_38,this);
  ErrorMgr::getErrorDescription(__return_storage_ptr__,this_00,(ErrorRef *)&BStack_38);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_38);
  return __return_storage_ptr__;
}

Assistant:

sl::StringRef
ErrorHdr::getDescription() const {
	return getErrorMgr()->getErrorDescription(this);
}